

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttributeSet *this,TiXmlAttribute *addMe)

{
  Rep *pRVar1;
  int iVar2;
  TiXmlAttribute *pTVar3;
  
  pRVar1 = (addMe->name).rep_;
  pTVar3 = &this->sentinel;
  do {
    pTVar3 = pTVar3->next;
    if (pTVar3 == &this->sentinel) {
      pTVar3 = (TiXmlAttribute *)0x0;
      break;
    }
    iVar2 = strcmp(((pTVar3->name).rep_)->str,pRVar1->str);
  } while (iVar2 != 0);
  if (pTVar3 != (TiXmlAttribute *)0x0) {
    __assert_fail("!Find(addMe->Name())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x516,"void despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttribute *)");
  }
  addMe->next = &this->sentinel;
  addMe->prev = (this->sentinel).prev;
  ((this->sentinel).prev)->next = addMe;
  (this->sentinel).prev = addMe;
  return;
}

Assistant:

void TiXmlAttributeSet::Add(TiXmlAttribute* addMe) {
#ifdef TIXML_USE_STL
	assert( !Find( TIXML_STRING( addMe->Name() ) ) ); // Shouldn't be multiply adding to the set.
#else
	assert(!Find(addMe->Name())); // Shouldn't be multiply adding to the set.
#endif

	addMe->next = &sentinel;
	addMe->prev = sentinel.prev;

	sentinel.prev->next = addMe;
	sentinel.prev = addMe;
}